

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
extract_attr_tiledesc
          (exr_context_t ctxt,_internal_exr_seq_scratch *scratch,exr_attr_tiledesc_t *attrdata,
          char *aname,char *tname,int32_t attrsz)

{
  int iVar1;
  uint32_t uVar2;
  undefined8 in_RCX;
  uint32_t *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int in_R9D;
  exr_result_t rv;
  exr_result_t local_4;
  
  if (in_R9D == 9) {
    iVar1 = (**(code **)(in_RSI + 0x20))(in_RSI,in_RDX,9);
    if (iVar1 == 0) {
      uVar2 = one_to_native32(0);
      *in_RDX = uVar2;
      uVar2 = one_to_native32(0);
      in_RDX[1] = uVar2;
      if (((byte)in_RDX[2] & 0xf) < 3) {
        if ((uint)((int)(uint)(byte)in_RDX[2] >> 4) < 2) {
          local_4 = 0;
        }
        else {
          local_4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,0xe,
                               "Attribute \'%s\': Invalid tile rounding specification encountered: found enum %d"
                               ,in_RCX,(int)(uint)(byte)in_RDX[2] >> 4);
        }
      }
      else {
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xe,
                             "Attribute \'%s\': Invalid tile level specification encountered: found enum %d"
                             ,in_RCX,(byte)in_RDX[2] & 0xf);
      }
    }
    else {
      local_4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,iVar1,"Unable to read \'%s\' %s data",in_RCX,in_R8);
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0x11,"Attribute \'%s\': Invalid size %d (exp \'%s\' size %d)",in_RCX
                         ,in_R9D,in_R8,9);
  }
  return local_4;
}

Assistant:

static exr_result_t
extract_attr_tiledesc (
    exr_context_t                     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    exr_attr_tiledesc_t*              attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_result_t rv;
    if (attrsz != (int32_t) sizeof (*attrdata))
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s': Invalid size %d (exp '%s' size %d)",
            aname,
            attrsz,
            tname,
            (int32_t) sizeof (*attrdata));

    rv = scratch->sequential_read (scratch, attrdata, sizeof (*attrdata));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt, rv, "Unable to read '%s' %s data", aname, tname);

    attrdata->x_size = one_to_native32 (attrdata->x_size);
    attrdata->y_size = one_to_native32 (attrdata->y_size);

    if ((int) EXR_GET_TILE_LEVEL_MODE (*attrdata) >= (int) EXR_TILE_LAST_TYPE)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Attribute '%s': Invalid tile level specification encountered: found enum %d",
            aname,
            (int) EXR_GET_TILE_LEVEL_MODE (*attrdata));

    if ((int) EXR_GET_TILE_ROUND_MODE (*attrdata) >=
        (int) EXR_TILE_ROUND_LAST_TYPE)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Attribute '%s': Invalid tile rounding specification encountered: found enum %d",
            aname,
            (int) EXR_GET_TILE_ROUND_MODE (*attrdata));

    return rv;
}